

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O1

lddmc_ser * lddmc_ser_reversed_iter_next(avl_iter_t *iter)

{
  avl_iter_t *paVar1;
  long lVar2;
  size_t sVar3;
  lddmc_ser *plVar4;
  long *plVar5;
  size_t sVar6;
  size_t sVar7;
  
  if (iter[1].height == 0) {
    sVar6 = 0;
  }
  else {
    sVar3 = iter->height;
    plVar5 = (long *)iter[sVar3 + 1].height;
    if (plVar5 != (long *)0x0) {
      do {
        plVar5 = (long *)*plVar5;
        iter[sVar3 + 2].height = (size_t)plVar5;
        sVar3 = sVar3 + 1;
      } while (plVar5 != (long *)0x0);
      iter->height = sVar3;
    }
    sVar6 = iter[sVar3].height;
    sVar7 = *(size_t *)(sVar6 + 8);
    if (sVar7 == 0) {
      sVar3 = iter->height;
      do {
        if (sVar3 == 1) {
          sVar3 = 0;
          break;
        }
        lVar2 = sVar3 - 1;
        paVar1 = iter + sVar3;
        sVar3 = sVar3 - 1;
      } while (paVar1->height == *(size_t *)(iter[lVar2].height + 8));
      iter->height = sVar3;
      sVar7 = 0;
    }
    iter[sVar3 + 1].height = sVar7;
  }
  plVar4 = (lddmc_ser *)(sVar6 + 0x18);
  if (sVar6 == 0) {
    plVar4 = (lddmc_ser *)0x0;
  }
  return plVar4;
}

Assistant:

static inline avl_node_t*
avl_iter_next(avl_iter_t *iter)
{
    /* when first node is NULL, we're done */
    if (iter->nodes[0] == NULL) return NULL;

    /* if the head is not NULL, first entry... */
    while (iter->nodes[iter->height] != NULL) {
        iter->nodes[iter->height+1] = iter->nodes[iter->height]->left;
        iter->height++;
    }

    /* head is now NULL, take parent as result */
    avl_node_t *result = iter->nodes[iter->height-1];

    if (result->right != NULL) {
        /* if we can go right, do that */
        iter->nodes[iter->height] = result->right;
    } else {
        /* cannot go right, backtrack */
        do {
            iter->height--;
        } while (iter->height > 0 && iter->nodes[iter->height] == iter->nodes[iter->height-1]->right);
        iter->nodes[iter->height] = NULL; /* set head to NULL: second entry */
    }

    return result;
}